

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::HlslParseContext::decomposeGeometryMethods
          (HlslParseContext *this,TSourceLoc *loc,TIntermTyped **node,TIntermNode *arguments)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TIntermAggregate *pTVar4;
  long lVar5;
  TIntermNode *right;
  TIntermAggregate *left;
  TSourceLoc *s;
  undefined1 local_c8 [16];
  char *pcStack_b8;
  undefined8 local_b0;
  long *plVar3;
  
  if (*node == (TIntermTyped *)0x0) {
    return;
  }
  s = loc;
  iVar1 = (*((*node)->super_TIntermNode)._vptr_TIntermNode[4])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    return;
  }
  iVar1 = (*((*node)->super_TIntermNode)._vptr_TIntermNode[4])();
  iVar1 = *(int *)(CONCAT44(extraout_var_00,iVar1) + 0xb8);
  if (arguments == (TIntermNode *)0x0) {
    plVar3 = (long *)0x0;
  }
  else {
    iVar2 = (*arguments->_vptr_TIntermNode[6])(arguments);
    plVar3 = (long *)CONCAT44(extraout_var_01,iVar2);
  }
  if (iVar1 == 0x2d6) {
    if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangGeometry) {
      pTVar4 = (TIntermAggregate *)TIntermNode::operator_new((TIntermNode *)0x188,(size_t)s);
      TIntermAggregate::TIntermAggregate(pTVar4,EOpEndPrimitive);
      (*(pTVar4->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[1])
                (pTVar4);
      TType::TType((TType *)local_c8,EbtVoid,EvqTemporary,1,0,0,false);
      (*(pTVar4->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x1d]
      )(pTVar4,(TType *)local_c8);
      goto LAB_0039366a;
    }
  }
  else {
    if (iVar1 != 0x2d5) {
      return;
    }
    if (plVar3 == (long *)0x0) {
      return;
    }
    if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangGeometry) {
      pTVar4 = (TIntermAggregate *)TIntermNode::operator_new((TIntermNode *)0x188,(size_t)s);
      TIntermAggregate::TIntermAggregate(pTVar4,EOpEmitVertex);
      (*(pTVar4->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[1])
                (pTVar4);
      TType::TType((TType *)local_c8,EbtVoid,EvqTemporary,1,0,0,false);
      (*(pTVar4->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x1d]
      )(pTVar4);
      lVar5 = (**(code **)(*plVar3 + 0x198))(plVar3);
      right = (TIntermNode *)(**(code **)(**(long **)(*(long *)(lVar5 + 8) + 8) + 0x18))();
      left = TIntermediate::growAggregate
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                        (TIntermNode *)0x0,right,loc);
      pTVar4 = TIntermediate::growAggregate
                         ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                          (TIntermNode *)left,(TIntermNode *)pTVar4);
      (*(pTVar4->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x31]
      )(pTVar4,1);
      (*(pTVar4->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[1])
                (pTVar4);
      TType::TType((TType *)local_c8,EbtVoid,EvqTemporary,1,0,0,false);
      (*(pTVar4->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x1d]
      )(pTVar4,(TType *)local_c8);
      local_c8._8_8_ = loc->name;
      pcStack_b8 = *(char **)&loc->string;
      local_b0._0_4_ = loc->column;
      local_b0._4_4_ = *(undefined4 *)&loc->field_0x14;
      local_c8._0_8_ = pTVar4;
      std::
      vector<glslang::HlslParseContext::tGsAppendData,_glslang::pool_allocator<glslang::HlslParseContext::tGsAppendData>_>
      ::emplace_back<glslang::HlslParseContext::tGsAppendData>
                (&(this->gsAppends).
                  super_vector<glslang::HlslParseContext::tGsAppendData,_glslang::pool_allocator<glslang::HlslParseContext::tGsAppendData>_>
                 ,(tGsAppendData *)local_c8);
      goto LAB_0039366a;
    }
  }
  pTVar4 = (TIntermAggregate *)0x0;
LAB_0039366a:
  *node = (TIntermTyped *)pTVar4;
  return;
}

Assistant:

void HlslParseContext::decomposeGeometryMethods(const TSourceLoc& loc, TIntermTyped*& node, TIntermNode* arguments)
{
    if (node == nullptr || !node->getAsOperator())
        return;

    const TOperator op  = node->getAsOperator()->getOp();
    const TIntermAggregate* argAggregate = arguments ? arguments->getAsAggregate() : nullptr;

    switch (op) {
    case EOpMethodAppend:
        if (argAggregate) {
            // Don't emit these for non-GS stage, since we won't have the gsStreamOutput symbol.
            if (language != EShLangGeometry) {
                node = nullptr;
                return;
            }

            TIntermAggregate* sequence = nullptr;
            TIntermAggregate* emit = new TIntermAggregate(EOpEmitVertex);

            emit->setLoc(loc);
            emit->setType(TType(EbtVoid));

            TIntermTyped* data = argAggregate->getSequence()[1]->getAsTyped();

            // This will be patched in finalization during finalizeAppendMethods()
            sequence = intermediate.growAggregate(sequence, data, loc);
            sequence = intermediate.growAggregate(sequence, emit);

            sequence->setOperator(EOpSequence);
            sequence->setLoc(loc);
            sequence->setType(TType(EbtVoid));

            gsAppends.push_back({sequence, loc});

            node = sequence;
        }
        break;

    case EOpMethodRestartStrip:
        {
            // Don't emit these for non-GS stage, since we won't have the gsStreamOutput symbol.
            if (language != EShLangGeometry) {
                node = nullptr;
                return;
            }

            TIntermAggregate* cut = new TIntermAggregate(EOpEndPrimitive);
            cut->setLoc(loc);
            cut->setType(TType(EbtVoid));
            node = cut;
        }
        break;

    default:
        break; // most pass through unchanged
    }
}